

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHalf.h
# Opt level: O3

uint16_t Ptex::v2_4::PtexHalf::fromFloat(float val)

{
  ushort uVar1;
  uint uVar2;
  
  if ((val == 0.0) && (!NAN(val))) {
    return 0;
  }
  if (*(short *)(f2hTable + (ulong)((uint)val >> 0x17) * 2) != 0) {
    return *(short *)(f2hTable + (ulong)((uint)val >> 0x17) * 2) +
           (short)(((uint)val & 0x7ff000) + 0x1000 >> 0xd);
  }
  uVar1 = (ushort)((uint)val >> 0x10) & 0x8000;
  uVar2 = (uint)val >> 0xd & 0x3fc00;
  if (uVar2 < 0x1c001) {
    return uVar1 | (ushort)(int)(ABS(val) * 16777216.0 + 0.5);
  }
  if (uVar2 == 0x3fc00) {
    uVar1 = uVar1 | (ushort)((uint)val >> 0xd) & 0x3ff;
  }
  return uVar1 | 0x7c00;
}

Assistant:

static uint16_t fromFloat(float val)
    {
        if (val==0) return 0;
        union { uint32_t i; float f; } u;
        u.f = val;
        int e = f2hTable[(u.i>>23)&0x1ff];
        if (e) return (uint16_t)(e + (((u.i&0x7fffff) + 0x1000) >> 13));
        return fromFloat_except(u.i);
    }